

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Int_t * Abc_NtkNodeSupportInt(Abc_Ntk_t *pNtk,int iCo)

{
  Abc_Obj_t *pAVar1;
  Vec_Int_t *vNodes;
  int i;
  
  if (iCo < 0) {
    vNodes = (Vec_Int_t *)0x0;
  }
  else {
    vNodes = (Vec_Int_t *)0x0;
    if (iCo < pNtk->vCos->nSize) {
      while (i = (int)vNodes, i < pNtk->vCis->nSize) {
        pAVar1 = Abc_NtkCi(pNtk,i);
        (pAVar1->field_6).iTemp = i;
        vNodes = (Vec_Int_t *)(ulong)(i + 1);
      }
      Abc_NtkIncrementTravId(pNtk);
      pAVar1 = Abc_NtkCo(pNtk,iCo);
      vNodes = Vec_IntAlloc(100);
      Abc_NtkNodeSupportInt_rec
                ((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray],vNodes);
      qsort(vNodes->pArray,(long)vNodes->nSize,4,Vec_IntSortCompare1);
    }
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Abc_NtkNodeSupportInt( Abc_Ntk_t * pNtk, int iCo )
{
    Vec_Int_t * vNodes;
    Abc_Obj_t * pObj; 
    int i;
    if ( iCo < 0 || iCo >= Abc_NtkCoNum(pNtk) )
        return NULL;
    // save node indices in the CI nodes
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    // collect the indexes of CI nodes in the TFI of the CO node
    Abc_NtkIncrementTravId( pNtk );
    pObj = Abc_NtkCo( pNtk, iCo );
    vNodes = Vec_IntAlloc( 100 );
    Abc_NtkNodeSupportInt_rec( Abc_ObjFanin0(pObj), vNodes );
    Vec_IntSort( vNodes, 0 );
    return vNodes;
}